

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-iter.c
# Opt level: O1

void test_bson_iter_binary_deprecated(void)

{
  char cVar1;
  int iVar2;
  bson_t *pbVar3;
  ulong uVar4;
  bson_t *unaff_RBX;
  TestSuite *suite;
  int *unaff_R14;
  uint8_t *binary;
  uint32_t binary_len;
  bson_subtype_t subtype;
  bson_iter_t iter;
  undefined1 auStack_1318 [4104];
  bson_t *pbStack_310;
  code *pcStack_308;
  undefined8 uStack_290;
  undefined1 uStack_288;
  TestSuite aTStack_280 [5];
  code *pcStack_188;
  int *local_110;
  int local_108;
  undefined1 local_104 [4];
  undefined1 local_100 [232];
  
  pcStack_188 = (code *)0x12bd4d;
  pbVar3 = get_bson(
                   "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/binary/binary_deprecated.bson"
                   );
  if (pbVar3 == (bson_t *)0x0) {
    pcStack_188 = (code *)0x12bdc2;
    test_bson_iter_binary_deprecated_cold_5();
LAB_0012bdc2:
    pcStack_188 = (code *)0x12bdc7;
    test_bson_iter_binary_deprecated_cold_1();
LAB_0012bdc7:
    pcStack_188 = (code *)0x12bdcc;
    test_bson_iter_binary_deprecated_cold_2();
LAB_0012bdcc:
    pcStack_188 = (code *)0x12bdd1;
    test_bson_iter_binary_deprecated_cold_3();
  }
  else {
    pcStack_188 = (code *)0x12bd65;
    cVar1 = bson_iter_init(local_100,pbVar3);
    unaff_RBX = pbVar3;
    if (cVar1 == '\0') goto LAB_0012bdc2;
    pcStack_188 = (code *)0x12bd76;
    cVar1 = bson_iter_next(local_100);
    if (cVar1 == '\0') goto LAB_0012bdc7;
    unaff_R14 = &local_108;
    pcStack_188 = (code *)0x12bd99;
    bson_iter_binary(local_100,local_104,unaff_R14,&local_110);
    if (local_108 != 4) goto LAB_0012bdcc;
    if (*local_110 == 0x34333231) {
      pcStack_188 = (code *)0x12bdb4;
      bson_destroy(pbVar3);
      return;
    }
  }
  pcStack_188 = test_bson_iter_from_data;
  test_bson_iter_binary_deprecated_cold_4();
  uStack_290 = 0x100620800000009;
  uStack_288 = 0;
  suite = aTStack_280;
  pcStack_308 = (code *)0x12be0d;
  pcStack_188 = (code *)&stack0xfffffffffffffff8;
  cVar1 = bson_iter_init_from_data(suite,&uStack_290,9);
  if (cVar1 == '\0') {
    pcStack_308 = (code *)0x12be4f;
    test_bson_iter_from_data_cold_1();
LAB_0012be4f:
    pcStack_308 = (code *)0x12be54;
    test_bson_iter_from_data_cold_2();
LAB_0012be54:
    pcStack_308 = (code *)0x12be59;
    test_bson_iter_from_data_cold_3();
  }
  else {
    suite = aTStack_280;
    pcStack_308 = (code *)0x12be1e;
    cVar1 = bson_iter_next();
    if (cVar1 == '\0') goto LAB_0012be4f;
    suite = aTStack_280;
    pcStack_308 = (code *)0x12be2f;
    iVar2 = bson_iter_type();
    if (iVar2 != 8) goto LAB_0012be54;
    suite = aTStack_280;
    pcStack_308 = (code *)0x12be41;
    cVar1 = bson_iter_bool();
    if (cVar1 != '\0') {
      return;
    }
  }
  pcStack_308 = get_bson;
  test_bson_iter_from_data_cold_4();
  pbStack_310 = unaff_RBX;
  pcStack_308 = (code *)unaff_R14;
  iVar2 = open((char *)suite,0);
  if (iVar2 != -1) {
    uVar4 = read(iVar2,auStack_1318,0x1000);
    if ((long)uVar4 < 0) goto LAB_0012bec0;
    if (uVar4 != 0) {
      bson_new_from_data(auStack_1318,uVar4 & 0xffffffff);
      close(iVar2);
      return;
    }
    get_bson_cold_1();
  }
  get_bson_cold_3();
LAB_0012bec0:
  get_bson_cold_2();
  TestSuite_Add(suite,"/bson/as_json/x1000",test_bson_as_json_x1000);
  TestSuite_Add(suite,"/bson/as_json/multi",test_bson_as_json_multi);
  TestSuite_Add(suite,"/bson/as_json/string",test_bson_as_json_string);
  TestSuite_Add(suite,"/bson/as_json/int32",test_bson_as_json_int32);
  TestSuite_Add(suite,"/bson/as_json/int64",test_bson_as_json_int64);
  TestSuite_Add(suite,"/bson/as_json/double",test_bson_as_json_double);
  TestSuite_Add(suite,"/bson/as_json/double/nonfinite",test_bson_as_json_double_nonfinite);
  TestSuite_Add(suite,"/bson/as_json/code",test_bson_as_json_code);
  TestSuite_Add(suite,"/bson/as_json/date_time",test_bson_as_json_date_time);
  TestSuite_Add(suite,"/bson/as_json/regex",test_bson_as_json_regex);
  TestSuite_Add(suite,"/bson/as_json/symbol",test_bson_as_json_symbol);
  TestSuite_Add(suite,"/bson/as_json/utf8",test_bson_as_json_utf8);
  TestSuite_Add(suite,"/bson/as_json/dbpointer",test_bson_as_json_dbpointer);
  TestSuite_Add(suite,"/bson/as_canonical_extended_json/dbpointer",
                test_bson_as_canonical_extended_json_dbpointer);
  TestSuite_Add(suite,"/bson/as_json/stack_overflow",test_bson_as_json_stack_overflow);
  TestSuite_Add(suite,"/bson/as_json/corrupt",test_bson_corrupt);
  TestSuite_Add(suite,"/bson/as_json/corrupt_utf8",test_bson_corrupt_utf8);
  TestSuite_Add(suite,"/bson/as_json/corrupt_binary",test_bson_corrupt_binary);
  TestSuite_Add(suite,"/bson/as_json_spacing",test_bson_as_json_spacing);
  TestSuite_Add(suite,"/bson/array_as_json",test_bson_array_as_json);
  TestSuite_Add(suite,"/bson/json/allow_multiple",test_bson_json_allow_multiple);
  TestSuite_Add(suite,"/bson/json/read/buffering",test_bson_json_read_buffering);
  TestSuite_Add(suite,"/bson/json/read",test_bson_json_read);
  TestSuite_Add(suite,"/bson/json/inc",test_bson_json_inc);
  TestSuite_Add(suite,"/bson/json/array",test_bson_json_array);
  TestSuite_Add(suite,"/bson/json/array/single",test_bson_json_array_single);
  TestSuite_Add(suite,"/bson/json/array/int64",test_bson_json_array_int64);
  TestSuite_Add(suite,"/bson/json/array/subdoc",test_bson_json_array_subdoc);
  TestSuite_Add(suite,"/bson/json/date",test_bson_json_date);
  TestSuite_Add(suite,"/bson/json/date/legacy",test_bson_json_date_legacy);
  TestSuite_Add(suite,"/bson/json/date/long",test_bson_json_date_numberlong);
  TestSuite_Add(suite,"/bson/json/timestamp",test_bson_json_timestamp);
  TestSuite_Add(suite,"/bson/json/read/empty",test_bson_json_read_empty);
  TestSuite_Add(suite,"/bson/json/read/missing_complex",test_bson_json_read_missing_complex);
  TestSuite_Add(suite,"/bson/json/read/invalid_binary",test_bson_json_read_invalid_binary);
  TestSuite_Add(suite,"/bson/json/read/invalid_json",test_bson_json_read_invalid_json);
  TestSuite_Add(suite,"/bson/json/read/bad_cb",test_bson_json_read_bad_cb);
  TestSuite_Add(suite,"/bson/json/read/invalid",test_bson_json_read_invalid);
  TestSuite_Add(suite,"/bson/json/read/raw_utf8",test_bson_json_read_raw_utf8);
  TestSuite_Add(suite,"/bson/json/read/corrupt_utf8",test_bson_json_read_corrupt_utf8);
  TestSuite_Add(suite,"/bson/json/read/decimal128",test_bson_json_read_decimal128);
  TestSuite_Add(suite,"/bson/json/read/dbpointer",test_bson_json_read_dbpointer);
  TestSuite_Add(suite,"/bson/json/read/legacy_regex",test_bson_json_read_legacy_regex);
  TestSuite_Add(suite,"/bson/json/read/regex_options_order",test_bson_json_read_regex_options_order)
  ;
  TestSuite_Add(suite,"/bson/json/read/binary",test_bson_json_read_binary);
  TestSuite_Add(suite,"/bson/json/read/legacy_binary",test_bson_json_read_legacy_binary);
  TestSuite_Add(suite,"/bson/json/read/file",test_json_reader_new_from_file);
  TestSuite_Add(suite,"/bson/json/read/bad_path",test_json_reader_new_from_bad_path);
  TestSuite_Add(suite,"/bson/json/read/$numberLong",test_bson_json_number_long);
  TestSuite_Add(suite,"/bson/json/read/$numberLong/zero",test_bson_json_number_long_zero);
  TestSuite_Add(suite,"/bson/json/read/code",test_bson_json_code);
  TestSuite_Add(suite,"/bson/json/read/code/errors",test_bson_json_code_errors);
  TestSuite_Add(suite,"/bson/json/read/dbref",test_bson_json_dbref);
  TestSuite_Add(suite,"/bson/json/read/uescape",test_bson_json_uescape);
  TestSuite_Add(suite,"/bson/json/read/uescape/key",test_bson_json_uescape_key);
  TestSuite_Add(suite,"/bson/json/read/uescape/bad",test_bson_json_uescape_bad);
  TestSuite_Add(suite,"/bson/json/read/int32",test_bson_json_int32);
  TestSuite_Add(suite,"/bson/json/read/int64",test_bson_json_int64);
  TestSuite_Add(suite,"/bson/json/read/double",test_bson_json_double);
  TestSuite_Add(suite,"/bson/json/read/double/overflow",test_bson_json_double_overflow);
  TestSuite_Add(suite,"/bson/json/read/double/nan",test_bson_json_nan);
  TestSuite_Add(suite,"/bson/json/read/double/infinity",test_bson_json_infinity);
  TestSuite_Add(suite,"/bson/json/read/null",test_bson_json_null);
  TestSuite_Add(suite,"/bson/json/read/empty_final",test_bson_json_empty_final_object);
  TestSuite_Add(suite,"/bson/as_json/decimal128",test_bson_as_json_decimal128);
  TestSuite_Add(suite,"/bson/json/read/$numberDecimal",test_bson_json_number_decimal);
  TestSuite_Add(suite,"/bson/json/errors",test_bson_json_errors);
  TestSuite_Add(suite,"/bson/integer/width",test_bson_integer_width);
  TestSuite_Add(suite,"/bson/json/read/null_in_str",test_bson_json_null_in_str);
  TestSuite_Add(suite,"/bson/as_json/multi_object",test_bson_as_json_multi_object);
  return;
}

Assistant:

static void
test_bson_iter_binary_deprecated (void)
{
   bson_subtype_t subtype;
   uint32_t binary_len;
   const uint8_t *binary;
   bson_iter_t iter;
   bson_t *b;

   b = get_bson (BINARY_DIR "/binary_deprecated.bson");
   BSON_ASSERT (b);

   BSON_ASSERT (bson_iter_init (&iter, b));
   BSON_ASSERT (bson_iter_next (&iter));
   bson_iter_binary (&iter, &subtype, &binary_len, &binary);
   BSON_ASSERT (binary_len == 4);
   BSON_ASSERT (memcmp (binary, "1234", 4) == 0);

   bson_destroy (b);
}